

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

bool __thiscall
Map::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
contains(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Iterator IVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  PStack_38;
  
  std::__cxx11::string::string((string *)&PStack_38,(string *)key);
  PStack_38.value = 0;
  IVar1 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::search(&this->tree,&PStack_38);
  std::__cxx11::string::~string((string *)&PStack_38);
  return IVar1.node_ptr !=
         (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x0;
}

Assistant:

bool Map<Key, T>::contains(const Key& key) {
    auto search = tree.search(key);
    return search != nullptr;
}